

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

FabArray<amrex::TagBox> * __thiscall
amrex::FabArray<amrex::TagBox>::operator=
          (FabArray<amrex::TagBox> *this,FabArray<amrex::TagBox> *rhs)

{
  void *pvVar1;
  pointer ppTVar2;
  
  if (rhs != this) {
    clear(this);
    FabArrayBase::operator=(&this->super_FabArrayBase,&rhs->super_FabArrayBase);
    std::
    __uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    ::operator=((__uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)&this->m_factory,
                (__uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)&rhs->m_factory);
    (this->m_dallocator).m_arena = (rhs->m_dallocator).m_arena;
    this->define_function_called = rhs->define_function_called;
    std::_Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>::_Vector_impl_data::
    _M_swap_data((_Vector_impl_data *)&this->m_fabs_v,(_Vector_impl_data *)&rhs->m_fabs_v);
    pvVar1 = this->m_hp_arrays;
    this->m_hp_arrays = rhs->m_hp_arrays;
    rhs->m_hp_arrays = pvVar1;
    (this->m_arrays).hp = (rhs->m_arrays).hp;
    (this->m_const_arrays).hp = (rhs->m_const_arrays).hp;
    std::swap<amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&this->m_tags,&rhs->m_tags);
    ShMem::operator=(&this->shmem,&rhs->shmem);
    rhs->define_function_called = false;
    ppTVar2 = (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppTVar2) {
      (rhs->m_fabs_v).super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(rhs->m_tags).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    clear(rhs);
  }
  return this;
}

Assistant:

FabArray<FAB>&
FabArray<FAB>::operator= (FabArray<FAB>&& rhs) noexcept
{
    if (&rhs != this)
    {
        clear();

        FabArrayBase::operator=(std::move(rhs));
        m_factory = std::move(rhs.m_factory);
        m_dallocator = std::move(rhs.m_dallocator);
        define_function_called = rhs.define_function_called;
        std::swap(m_fabs_v, rhs.m_fabs_v);
#ifdef AMREX_USE_GPU
        std::swap(m_dp_arrays, rhs.m_dp_arrays);
#endif
        std::swap(m_hp_arrays, rhs.m_hp_arrays);
        m_arrays = rhs.m_arrays;
        m_const_arrays = rhs.m_const_arrays;
        std::swap(m_tags, rhs.m_tags);
        shmem = std::move(rhs.shmem);

        rhs.define_function_called = false;
        rhs.m_fabs_v.clear();
        rhs.m_tags.clear();
        rhs.clear();
    }
    return *this;
}